

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjoint_sets.h
# Opt level: O0

size_t __thiscall wasm::DisjointSets::getUnion(DisjointSets *this,size_t elem1,size_t elem2)

{
  ulong uVar1;
  size_t sVar2;
  size_type sVar3;
  reference pvVar4;
  bool bVar5;
  size_type local_38;
  size_t root2;
  size_t root1;
  size_t elem2_local;
  size_t elem1_local;
  DisjointSets *this_local;
  
  root1 = elem2;
  elem2_local = elem1;
  elem1_local = (size_t)this;
  sVar3 = std::vector<wasm::DisjointSets::ElemInfo,_std::allocator<wasm::DisjointSets::ElemInfo>_>::
          size(&this->info);
  sVar2 = root1;
  bVar5 = false;
  if (elem1 < sVar3) {
    sVar3 = std::vector<wasm::DisjointSets::ElemInfo,_std::allocator<wasm::DisjointSets::ElemInfo>_>
            ::size(&this->info);
    bVar5 = sVar2 < sVar3;
  }
  if (!bVar5) {
    __assert_fail("elem1 < info.size() && elem2 < info.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/disjoint_sets.h"
                  ,0x40,"size_t wasm::DisjointSets::getUnion(size_t, size_t)");
  }
  root2 = getRoot(this,elem2_local);
  local_38 = getRoot(this,root1);
  if (root2 == local_38) {
    this_local = (DisjointSets *)root2;
  }
  else {
    pvVar4 = std::
             vector<wasm::DisjointSets::ElemInfo,_std::allocator<wasm::DisjointSets::ElemInfo>_>::
             operator[](&this->info,root2);
    uVar1 = pvVar4->rank;
    pvVar4 = std::
             vector<wasm::DisjointSets::ElemInfo,_std::allocator<wasm::DisjointSets::ElemInfo>_>::
             operator[](&this->info,local_38);
    if (uVar1 < pvVar4->rank) {
      std::swap<unsigned_long>(&root2,&local_38);
    }
    sVar2 = root2;
    pvVar4 = std::
             vector<wasm::DisjointSets::ElemInfo,_std::allocator<wasm::DisjointSets::ElemInfo>_>::
             operator[](&this->info,local_38);
    pvVar4->parent = sVar2;
    pvVar4 = std::
             vector<wasm::DisjointSets::ElemInfo,_std::allocator<wasm::DisjointSets::ElemInfo>_>::
             operator[](&this->info,root2);
    sVar2 = pvVar4->rank;
    pvVar4 = std::
             vector<wasm::DisjointSets::ElemInfo,_std::allocator<wasm::DisjointSets::ElemInfo>_>::
             operator[](&this->info,local_38);
    if (sVar2 == pvVar4->rank) {
      pvVar4 = std::
               vector<wasm::DisjointSets::ElemInfo,_std::allocator<wasm::DisjointSets::ElemInfo>_>::
               operator[](&this->info,root2);
      pvVar4->rank = pvVar4->rank + 1;
    }
    this_local = (DisjointSets *)root2;
  }
  return (size_t)this_local;
}

Assistant:

size_t getUnion(size_t elem1, size_t elem2) {
    assert(elem1 < info.size() && elem2 < info.size());
    size_t root1 = getRoot(elem1);
    size_t root2 = getRoot(elem2);
    if (root1 == root2) {
      // Already in the same set.
      return root1;
    }
    // Canonicalize so that root1 has the greater rank.
    if (info[root1].rank < info[root2].rank) {
      std::swap(root1, root2);
    }
    // Merge the trees, smaller into larger.
    info[root2].parent = root1;
    // If the ranks were equal, the new root has a larger rank.
    if (info[root1].rank == info[root2].rank) {
      ++info[root1].rank;
    }
    return root1;
  }